

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicohandler.cpp
# Opt level: O0

void __thiscall QtIcoHandler::QtIcoHandler(QtIcoHandler *this,QIODevice *device)

{
  ICOReader *this_00;
  QIODevice *in_RSI;
  QImageIOHandler *in_RDI;
  
  QImageIOHandler::QImageIOHandler(in_RDI);
  *(undefined ***)in_RDI = &PTR__QtIcoHandler_00110a68;
  in_RDI[0x20] = (QImageIOHandler)0x0;
  *(undefined4 *)(in_RDI + 0x10) = 0;
  QImageIOHandler::setDevice((QIODevice *)in_RDI);
  this_00 = (ICOReader *)operator_new(0x48);
  ICOReader::ICOReader(this_00,in_RSI);
  *(ICOReader **)(in_RDI + 0x18) = this_00;
  return;
}

Assistant:

QtIcoHandler::QtIcoHandler(QIODevice *device)
{
    m_currentIconIndex = 0;
    setDevice(device);
    m_pICOReader = new ICOReader(device);
}